

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::delaunayrefinement(tetgenmesh *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  tetgenbehavior *ptVar5;
  long lVar6;
  arraypool *paVar7;
  memorypool *pmVar8;
  void *pvVar9;
  undefined8 *puVar10;
  tetrahedron *pppdVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  void **ppvVar16;
  double dVar17;
  
  lVar2 = this->flip32count;
  lVar3 = this->flip23count;
  lVar4 = this->flip44count;
  if (this->b->quiet == 0) {
    puts("Refining mesh...");
  }
  if (this->b->verbose != 0) {
    printf("  Min radiu-edge ratio = %g.\n",this->b->minratio);
    printf("  Min dihedral   angle = %g.\n",this->b->mindihedral);
  }
  ptVar5 = this->b;
  lVar13 = (long)ptVar5->steinerleft;
  this->steinerleft = lVar13;
  if (0 < lVar13) {
    lVar15 = this->st_facref_count + this->st_segref_count + this->st_volref_count;
    lVar14 = lVar13 - lVar15;
    if (lVar14 == 0 || lVar13 < lVar15) {
      if (ptVar5->quiet != 0) {
        return;
      }
      printf("\nWarning:  ");
      printf("The desired number of Steiner points (%d) has reached.\n\n",
             (ulong)(uint)this->b->steinerleft);
      return;
    }
    this->steinerleft = lVar14;
  }
  if ((this->useinsertradius != 0) &&
     (((ptVar5->plc != 0 && (ptVar5->nobisect != 0)) || (ptVar5->refine != 0)))) {
    makesegmentendpointsmap(this);
    makefacetverticesmap(this);
  }
  paVar7 = (arraypool *)operator_new(0x30);
  paVar7->objectbytes = 0x10;
  paVar7->objectsperblock = 0x100;
  paVar7->log2objectsperblock = 8;
  paVar7->objectsperblockmark = 0xff;
  paVar7->toparraylen = 0;
  paVar7->toparray = (char **)0x0;
  paVar7->objects = 0;
  paVar7->totalmemory = 0;
  this->encseglist = paVar7;
  paVar7 = (arraypool *)operator_new(0x30);
  paVar7->objectbytes = 0x88;
  paVar7->objectsperblock = 0x100;
  paVar7->log2objectsperblock = 8;
  paVar7->objectsperblockmark = 0xff;
  paVar7->toparraylen = 0;
  paVar7->toparray = (char **)0x0;
  paVar7->objects = 0;
  paVar7->totalmemory = 0;
  this->encshlist = paVar7;
  if ((this->b->nobisect != 0) && (this->checkconstraints == 0)) {
LAB_0014d711:
    if (2 < this->b->reflevel) {
      if (this->b->verbose != 0) {
        puts("  Splitting bad quality tets.");
      }
      lVar13 = this->points->items;
      lVar14 = this->st_segref_count;
      lVar15 = this->st_facref_count;
      lVar6 = this->st_volref_count;
      dVar17 = cos((this->b->mindihedral / 180.0) * PI);
      this->cosmindihed = dVar17;
      pmVar8 = (memorypool *)operator_new(0x58);
      memorypool::poolinit(pmVar8,0x10,this->b->tetrahedraperblock,8,0);
      this->badtetrahedrons = pmVar8;
      pmVar8 = this->tetrahedrons;
      ppvVar16 = pmVar8->firstblock;
      pmVar8->pathblock = ppvVar16;
      pmVar8->pathitem =
           (void *)((long)ppvVar16 +
                   (((long)pmVar8->alignbytes + 8U) -
                   (ulong)(ppvVar16 + 1) % (ulong)(long)pmVar8->alignbytes));
      pmVar8->pathitemsleft = pmVar8->itemsperblock;
      pppdVar11 = tetrahedrontraverse(this);
      while (pppdVar11 != (tetrahedron *)0x0) {
        uVar1 = *(uint *)((long)pppdVar11 + (long)this->elemmarkerindex * 4);
        if ((uVar1 >> 0xc & 1) == 0) {
          *(uint *)((long)pppdVar11 + (long)this->elemmarkerindex * 4) = uVar1 | 0x1000;
          plVar12 = (long *)memorypool::alloc(this->badtetrahedrons);
          *plVar12 = (long)pppdVar11;
          *(undefined4 *)(plVar12 + 1) = 0;
        }
        pppdVar11 = tetrahedrontraverse(this);
      }
      repairbadtets(this,4);
      if (this->b->verbose != 0) {
        printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n",this->points->items - lVar13,
               this->st_segref_count - lVar14,this->st_facref_count - lVar15,
               this->st_volref_count - lVar6);
      }
    }
    if ((this->b->verbose != 0) &&
       (lVar2 + lVar3 + lVar4 < this->flip32count + this->flip23count + this->flip44count)) {
      printf("  Performed %ld flips.\n");
    }
    if ((this->steinerleft == 0) && (this->b->quiet == 0)) {
      printf("\nWarnning:  ");
      printf("The desired number of Steiner points (%d) is reached.\n\n",
             (ulong)(uint)this->b->steinerleft);
    }
    paVar7 = this->encseglist;
    if (paVar7 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar7);
      operator_delete(paVar7,0x30);
    }
    paVar7 = this->encshlist;
    if (paVar7 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar7);
      operator_delete(paVar7,0x30);
    }
    this->encseglist = (arraypool *)0x0;
    this->encshlist = (arraypool *)0x0;
    if ((this->b->nobisect == 0) || (this->checkconstraints != 0)) {
      pmVar8 = this->badsubsegs;
      this->totalworkmemory = this->totalworkmemory + (long)pmVar8->itembytes * pmVar8->maxitems;
      if (pmVar8 != (memorypool *)0x0) {
        ppvVar16 = pmVar8->firstblock;
        while (ppvVar16 != (void **)0x0) {
          pmVar8->nowblock = (void **)*ppvVar16;
          free(ppvVar16);
          ppvVar16 = pmVar8->nowblock;
          pmVar8->firstblock = ppvVar16;
        }
        operator_delete(pmVar8,0x58);
      }
      this->badsubsegs = (memorypool *)0x0;
      if (1 < this->b->reflevel) {
        pmVar8 = this->badsubfacs;
        this->totalworkmemory = this->totalworkmemory + (long)pmVar8->itembytes * pmVar8->maxitems;
        if (pmVar8 != (memorypool *)0x0) {
          ppvVar16 = pmVar8->firstblock;
          while (ppvVar16 != (void **)0x0) {
            pmVar8->nowblock = (void **)*ppvVar16;
            free(ppvVar16);
            ppvVar16 = pmVar8->nowblock;
            pmVar8->firstblock = ppvVar16;
          }
          operator_delete(pmVar8,0x58);
        }
        this->badsubfacs = (memorypool *)0x0;
      }
    }
    if (2 < this->b->reflevel) {
      pmVar8 = this->badtetrahedrons;
      this->totalworkmemory = this->totalworkmemory + (long)pmVar8->itembytes * pmVar8->maxitems;
      if (pmVar8 != (memorypool *)0x0) {
        ppvVar16 = pmVar8->firstblock;
        while (ppvVar16 != (void **)0x0) {
          pmVar8->nowblock = (void **)*ppvVar16;
          free(ppvVar16);
          ppvVar16 = pmVar8->nowblock;
          pmVar8->firstblock = ppvVar16;
        }
        operator_delete(pmVar8,0x58);
      }
      this->badtetrahedrons = (memorypool *)0x0;
    }
    return;
  }
  if (this->b->verbose != 0) {
    puts("  Splitting encroached subsegments.");
  }
  lVar13 = this->points->items;
  pmVar8 = (memorypool *)operator_new(0x58);
  memorypool::poolinit(pmVar8,0x10,this->b->shellfaceperblock,8,0);
  this->badsubsegs = pmVar8;
  pmVar8 = this->subsegs;
  ppvVar16 = pmVar8->firstblock;
  pmVar8->pathblock = ppvVar16;
  pmVar8->pathitem =
       (void *)((long)ppvVar16 +
               (((long)pmVar8->alignbytes + 8U) -
               (ulong)(ppvVar16 + 1) % (ulong)(long)pmVar8->alignbytes));
  pmVar8->pathitemsleft = pmVar8->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(pmVar8);
    if (pvVar9 == (void *)0x0) goto LAB_0014d537;
  } while (*(long *)((long)pvVar9 + 0x18) == 0);
LAB_0014d53a:
  while (pvVar9 != (void *)0x0) {
    uVar1 = *(uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4);
    if ((uVar1 & 4) == 0) {
      pmVar8 = this->badsubsegs;
      *(uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4) = uVar1 | 4;
      puVar10 = (undefined8 *)memorypool::alloc(pmVar8);
      *puVar10 = pvVar9;
      *(undefined4 *)(puVar10 + 1) = 0;
    }
    pmVar8 = this->subsegs;
    do {
      pvVar9 = memorypool::traverse(pmVar8);
      if (pvVar9 == (void *)0x0) goto LAB_0014d537;
    } while (*(long *)((long)pvVar9 + 0x18) == 0);
  }
  repairencsegs(this,1);
  if (this->b->verbose != 0) {
    printf("  Added %ld Steiner points.\n",this->points->items - lVar13);
  }
  if (this->b->reflevel < 2) goto LAB_0014d711;
  if (this->b->verbose != 0) {
    puts("  Splitting encroached subfaces.");
  }
  lVar13 = this->points->items;
  lVar14 = this->st_segref_count;
  lVar15 = this->st_facref_count;
  pmVar8 = (memorypool *)operator_new(0x58);
  memorypool::poolinit(pmVar8,0x10,this->b->shellfaceperblock,8,0);
  this->badsubfacs = pmVar8;
  pmVar8 = this->subfaces;
  ppvVar16 = pmVar8->firstblock;
  pmVar8->pathblock = ppvVar16;
  pmVar8->pathitem =
       (void *)((long)ppvVar16 +
               (((long)pmVar8->alignbytes + 8U) -
               (ulong)(ppvVar16 + 1) % (ulong)(long)pmVar8->alignbytes));
  pmVar8->pathitemsleft = pmVar8->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(pmVar8);
    if (pvVar9 == (void *)0x0) goto LAB_0014d678;
  } while (*(long *)((long)pvVar9 + 0x18) == 0);
LAB_0014d67b:
  while (pvVar9 != (void *)0x0) {
    uVar1 = *(uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4);
    if ((uVar1 & 4) == 0) {
      pmVar8 = this->badsubfacs;
      *(uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4) = uVar1 | 4;
      puVar10 = (undefined8 *)memorypool::alloc(pmVar8);
      *puVar10 = pvVar9;
      *(undefined4 *)(puVar10 + 1) = 0;
    }
    pmVar8 = this->subfaces;
    do {
      pvVar9 = memorypool::traverse(pmVar8);
      if (pvVar9 == (void *)0x0) goto LAB_0014d678;
    } while (*(long *)((long)pvVar9 + 0x18) == 0);
  }
  repairencfacs(this,2);
  if (this->b->verbose != 0) {
    printf("  Added %ld (%ld,%ld) Steiner points.\n",this->points->items - lVar13,
           this->st_segref_count - lVar14,this->st_facref_count - lVar15);
  }
  goto LAB_0014d711;
LAB_0014d537:
  pvVar9 = (void *)0x0;
  goto LAB_0014d53a;
LAB_0014d678:
  pvVar9 = (void *)0x0;
  goto LAB_0014d67b;
}

Assistant:

void tetgenmesh::delaunayrefinement()
{
  triface checktet;
  face checksh;
  face checkseg;
  long steinercount;
  int chkencflag;

  long bak_segref_count, bak_facref_count, bak_volref_count;
  long bak_flipcount = flip23count + flip32count + flip44count;

  if (!b->quiet) {
    printf("Refining mesh...\n");
  }

  if (b->verbose) {
    printf("  Min radiu-edge ratio = %g.\n", b->minratio);
    printf("  Min dihedral   angle = %g.\n", b->mindihedral);
    //printf("  Min Edge length = %g.\n", b->minedgelength);
  }

  steinerleft = b->steinerleft;  // Upperbound of # Steiner points (by -S#).
  if (steinerleft > 0) {
    // Check if we've already used up the given number of Steiner points.
    steinercount = st_segref_count + st_facref_count + st_volref_count;
    if (steinercount < steinerleft) {
      steinerleft -= steinercount;
    } else {
      if (!b->quiet) {
        printf("\nWarning:  ");
        printf("The desired number of Steiner points (%d) has reached.\n\n",
               b->steinerleft);
      }
      return; // No more Steiner points.
    }
  }

  if (useinsertradius) {
    if ((b->plc && b->nobisect) || b->refine) { // '-pY' or '-r' option.
      makesegmentendpointsmap();
      makefacetverticesmap();
    }
  }


  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);


  //if (!b->nobisect) { // if no '-Y' option
  if (!b->nobisect || checkconstraints) {
    if (b->verbose) {
      printf("  Splitting encroached subsegments.\n");
    }

    chkencflag = 1; // Only check encroaching subsegments.
    steinercount = points->items;

    // Initialize the pool of encroached subsegments.
    badsubsegs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                sizeof(void *), 0);

    // Add all segments into the pool.
    subsegs->traversalinit();
    checkseg.sh = shellfacetraverse(subsegs);
    while (checkseg.sh != (shellface *) NULL) {
      enqueuesubface(badsubsegs, &checkseg);
      checkseg.sh = shellfacetraverse(subsegs);
    }

    // Split all encroached segments.
    repairencsegs(chkencflag);

    if (b->verbose) {
      printf("  Added %ld Steiner points.\n", points->items - steinercount);
    }

    if (b->reflevel > 1) { // '-D2' option
      if (b->verbose) {
        printf("  Splitting encroached subfaces.\n");
      }

      chkencflag = 2; // Only check encroaching subfaces.
      steinercount = points->items;
      bak_segref_count = st_segref_count;
      bak_facref_count = st_facref_count;

      // Initialize the pool of encroached subfaces.
      badsubfacs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                  sizeof(void *), 0);

      // Add all subfaces into the pool.
      subfaces->traversalinit();
      checksh.sh = shellfacetraverse(subfaces);
      while (checksh.sh != (shellface *) NULL) {
        enqueuesubface(badsubfacs, &checksh);
        checksh.sh = shellfacetraverse(subfaces);
      }

      // Split all encroached subfaces.
      repairencfacs(chkencflag);

      if (b->verbose) {
        printf("  Added %ld (%ld,%ld) Steiner points.\n",  
               points->items-steinercount, st_segref_count-bak_segref_count,
               st_facref_count-bak_facref_count);
      }
    } // if (b->reflevel > 1)
  } // if (!b->nobisect)

  if (b->reflevel > 2) { // '-D3' option (The default option)
    if (b->verbose) {
      printf("  Splitting bad quality tets.\n");
    }

    chkencflag = 4; // Only check tetrahedra.
    steinercount = points->items;
    bak_segref_count = st_segref_count;
    bak_facref_count = st_facref_count;
    bak_volref_count = st_volref_count;

    // The cosine value of the min dihedral angle (-qq) for tetrahedra.
    cosmindihed = cos(b->mindihedral / 180.0 * PI);

    // Initialize the pool of bad quality tetrahedra.
    badtetrahedrons = new memorypool(sizeof(triface), b->tetrahedraperblock,
                                     sizeof(void *), 0);
    // Add all tetrahedra (no hull tets) into the pool.
    tetrahedrons->traversalinit();
    checktet.tet = tetrahedrontraverse();
    while (checktet.tet != NULL) {
      enqueuetetrahedron(&checktet);
      checktet.tet = tetrahedrontraverse();
    }

    // Split all bad quality tetrahedra.
    repairbadtets(chkencflag);

    if (b->verbose) {
      printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n", 
             points->items - steinercount, 
             st_segref_count - bak_segref_count,
             st_facref_count - bak_facref_count,
             st_volref_count - bak_volref_count);
    }
  } // if (b->reflevel > 2)

  if (b->verbose) {
    if (flip23count + flip32count + flip44count > bak_flipcount) {
      printf("  Performed %ld flips.\n", flip23count + flip32count +
             flip44count - bak_flipcount);
    }
  }

  if (steinerleft == 0) {
    if (!b->quiet) {
      printf("\nWarnning:  ");
      printf("The desired number of Steiner points (%d) is reached.\n\n",
             b->steinerleft);
    }
  }


  delete encseglist;
  delete encshlist;
  encseglist = NULL;
  encshlist = NULL;

  if (!b->nobisect || checkconstraints) {
    totalworkmemory += (badsubsegs->maxitems * badsubsegs->itembytes);
    delete badsubsegs;
    badsubsegs = NULL;
    if (b->reflevel > 1) {
      totalworkmemory += (badsubfacs->maxitems * badsubfacs->itembytes);
      delete badsubfacs;
      badsubfacs = NULL;
    }
  }
  if (b->reflevel > 2) {
    totalworkmemory += (badtetrahedrons->maxitems*badtetrahedrons->itembytes);
    delete badtetrahedrons;
    badtetrahedrons = NULL;
  }
}